

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execTasEa<(moira::Instr)124,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 uVar1;
  ulong in_RAX;
  u32 data;
  u32 ea;
  undefined8 local_28;
  
  local_28 = in_RAX;
  (*this->_vptr_Moira[0xb])();
  readOp<(moira::Mode)2,(moira::Size)1,0ul>
            (this,opcode & 7,(u32 *)((long)&local_28 + 4),(u32 *)&local_28);
  (this->reg).sr.n = (bool)((byte)local_28 >> 7);
  (this->reg).sr.z = (byte)local_28 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  local_28 = local_28 | 0x80;
  (*this->_vptr_Moira[0x19])(this,2);
  writeM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,local_28._4_4_,(u32)local_28);
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  return;
}

Assistant:

void
Moira::execTasEa(u16 opcode)
{
    signalTAS();

    int dst = ( _____________xxx(opcode) );

    u32 ea, data;
    readOp<M,Byte>(dst, ea, data);

    reg.sr.n = NBIT<Byte>(data);
    reg.sr.z = ZERO<Byte>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
    data |= 0x80;

    if (!isRegMode(M)) sync(2);
    writeOp <M,S> (dst, ea, data);

    prefetch<POLLIPL>();
}